

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_converter<signed_char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
::operator()(arg_converter<signed_char,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
             *this,char value)

{
  undefined8 *puVar1;
  bool bVar2;
  long *in_RDI;
  bool bVar3;
  bool is_signed;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  uint *in_stack_ffffffffffffff50;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  bVar3 = true;
  if ((char)in_RDI[1] != 'd') {
    bVar3 = (char)in_RDI[1] == 'i';
  }
  bVar2 = const_check<bool>(true);
  if (bVar2) {
    if (bVar3) {
      make_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
                ((int *)in_stack_ffffffffffffff50);
      puVar1 = (undefined8 *)*in_RDI;
      *puVar1 = local_38;
      puVar1[1] = local_30;
      *(undefined4 *)(puVar1 + 2) = local_28;
    }
    else {
      make_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,unsigned_int>
                (in_stack_ffffffffffffff50);
      puVar1 = (undefined8 *)*in_RDI;
      *puVar1 = local_68;
      puVar1[1] = local_60;
      *(undefined4 *)(puVar1 + 2) = local_58;
    }
  }
  else if (bVar3) {
    make_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,long_long>
              ((longlong *)in_stack_ffffffffffffff50);
    puVar1 = (undefined8 *)*in_RDI;
    *puVar1 = local_98;
    puVar1[1] = local_90;
    *(undefined4 *)(puVar1 + 2) = local_88;
  }
  else {
    make_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,unsigned_char>
              ((uchar *)in_stack_ffffffffffffff50);
    puVar1 = (undefined8 *)*in_RDI;
    *puVar1 = local_c8;
    puVar1[1] = local_c0;
    *(undefined4 *)(puVar1 + 2) = local_b8;
  }
  return;
}

Assistant:

typename std::enable_if<std::is_integral<U>::value>::type
      operator()(U value) {
    bool is_signed = type_ == 'd' || type_ == 'i';
    typedef typename std::conditional<
        std::is_same<T, void>::value, U, T>::type TargetType;
    if (const_check(sizeof(TargetType) <= sizeof(int))) {
      // Extra casts are used to silence warnings.
      if (is_signed) {
        arg_ = internal::make_arg<Context>(
          static_cast<int>(static_cast<TargetType>(value)));
      } else {
        typedef typename make_unsigned_or_bool<TargetType>::type Unsigned;
        arg_ = internal::make_arg<Context>(
          static_cast<unsigned>(static_cast<Unsigned>(value)));
      }
    } else {
      if (is_signed) {
        // glibc's printf doesn't sign extend arguments of smaller types:
        //   std::printf("%lld", -42);  // prints "4294967254"
        // but we don't have to do the same because it's a UB.
        arg_ = internal::make_arg<Context>(static_cast<long long>(value));
      } else {
        arg_ = internal::make_arg<Context>(
          static_cast<typename make_unsigned_or_bool<U>::type>(value));
      }
    }
  }